

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O3

void __thiscall DIS::IntercomSignalPdu::marshal(IntercomSignalPdu *this,DataStream *dataStream)

{
  uchar *puVar1;
  uchar *byte;
  uchar *puVar2;
  
  RadioCommunicationsFamilyPdu::marshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  EntityID::marshal(&this->_entityID,dataStream);
  DataStream::operator<<(dataStream,this->_communicationsDeviceID);
  DataStream::operator<<(dataStream,this->_encodingScheme);
  DataStream::operator<<(dataStream,this->_tdlType);
  DataStream::operator<<(dataStream,this->_sampleRate);
  DataStream::operator<<
            (dataStream,
             (short)*(undefined4 *)
                     &(this->_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             (short)*(undefined4 *)
                     &(this->_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  DataStream::operator<<(dataStream,this->_samples);
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    DataStream::operator<<(dataStream,*puVar2);
  }
  return;
}

Assistant:

void IntercomSignalPdu::marshal(DataStream &dataStream) const {
  RadioCommunicationsFamilyPdu::marshal(
      dataStream); // Marshal information in superclass first
  _entityID.marshal(dataStream);
  dataStream << _communicationsDeviceID;
  dataStream << _encodingScheme;
  dataStream << _tdlType;
  dataStream << _sampleRate;
  dataStream << (unsigned short)_data.size();
  dataStream << _samples;

  for (auto &byte : _data) {
    dataStream << byte;
  }
}